

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::FixVariablePS::execute
          (FixVariablePS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *r,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  cpp_dec_float<100U,_int,_void> *pcVar1;
  uint *puVar2;
  uint *puVar3;
  bool bVar4;
  int iVar5;
  int32_t iVar6;
  pointer pnVar7;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar8;
  bool bVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar17;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  *pDVar18;
  int iVar19;
  VarStatus VVar20;
  long lVar21;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar22;
  fpclass_type fVar23;
  cpp_dec_float<100U,_int,_void> *pcVar24;
  cpp_dec_float<100U,_int,_void> *pcVar25;
  long lVar26;
  cpp_dec_float<100U,_int,_void> local_388;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_330;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  *local_328;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_320;
  cpp_dec_float<100U,_int,_void> local_318;
  uint local_2c8 [2];
  uint auStack_2c0 [2];
  uint local_2b8;
  uint uStack_2b4;
  uint uStack_2b0;
  uint uStack_2ac;
  uint local_2a8;
  uint uStack_2a4;
  uint uStack_2a0;
  uint uStack_29c;
  uint local_298;
  uint uStack_294;
  uint uStack_290;
  uint uStack_28c;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  uint local_248 [2];
  uint auStack_240 [2];
  uint local_238;
  uint uStack_234;
  uint uStack_230;
  uint uStack_22c;
  uint local_228;
  uint uStack_224;
  uint uStack_220;
  uint uStack_21c;
  uint local_218;
  uint uStack_214;
  uint uStack_210;
  uint uStack_20c;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  cpp_dec_float<100U,_int,_void> local_1c8;
  cpp_dec_float<100U,_int,_void> local_178;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  int local_98;
  undefined1 local_94;
  undefined8 local_90;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_80;
  
  lVar21 = (long)this->m_j;
  if (this->m_correctIdx == true) {
    pnVar7 = (x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar19 = this->m_old_j;
    uVar10 = *(undefined8 *)&pnVar7[lVar21].m_backend.data;
    uVar11 = *(undefined8 *)(pnVar7[lVar21].m_backend.data._M_elems + 2);
    puVar3 = pnVar7[lVar21].m_backend.data._M_elems + 4;
    uVar12 = *(undefined8 *)puVar3;
    uVar13 = *(undefined8 *)(puVar3 + 2);
    puVar3 = pnVar7[lVar21].m_backend.data._M_elems + 8;
    uVar14 = *(undefined8 *)puVar3;
    uVar15 = *(undefined8 *)(puVar3 + 2);
    puVar3 = pnVar7[lVar21].m_backend.data._M_elems + 0xc;
    uVar16 = *(undefined8 *)(puVar3 + 2);
    puVar2 = pnVar7[iVar19].m_backend.data._M_elems + 0xc;
    *(undefined8 *)puVar2 = *(undefined8 *)puVar3;
    *(undefined8 *)(puVar2 + 2) = uVar16;
    puVar3 = pnVar7[iVar19].m_backend.data._M_elems + 8;
    *(undefined8 *)puVar3 = uVar14;
    *(undefined8 *)(puVar3 + 2) = uVar15;
    puVar3 = pnVar7[iVar19].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar3 = uVar12;
    *(undefined8 *)(puVar3 + 2) = uVar13;
    *(undefined8 *)&pnVar7[iVar19].m_backend.data = uVar10;
    *(undefined8 *)(pnVar7[iVar19].m_backend.data._M_elems + 2) = uVar11;
    pnVar7[iVar19].m_backend.exp = pnVar7[lVar21].m_backend.exp;
    pnVar7[iVar19].m_backend.neg = pnVar7[lVar21].m_backend.neg;
    iVar6 = pnVar7[lVar21].m_backend.prec_elem;
    pnVar7[iVar19].m_backend.fpclass = pnVar7[lVar21].m_backend.fpclass;
    pnVar7[iVar19].m_backend.prec_elem = iVar6;
    iVar19 = this->m_j;
    pnVar7 = (r->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar5 = this->m_old_j;
    uVar10 = *(undefined8 *)&pnVar7[iVar19].m_backend.data;
    uVar11 = *(undefined8 *)(pnVar7[iVar19].m_backend.data._M_elems + 2);
    puVar3 = pnVar7[iVar19].m_backend.data._M_elems + 4;
    uVar12 = *(undefined8 *)puVar3;
    uVar13 = *(undefined8 *)(puVar3 + 2);
    puVar3 = pnVar7[iVar19].m_backend.data._M_elems + 8;
    uVar14 = *(undefined8 *)puVar3;
    uVar15 = *(undefined8 *)(puVar3 + 2);
    puVar3 = pnVar7[iVar19].m_backend.data._M_elems + 0xc;
    uVar16 = *(undefined8 *)(puVar3 + 2);
    puVar2 = pnVar7[iVar5].m_backend.data._M_elems + 0xc;
    *(undefined8 *)puVar2 = *(undefined8 *)puVar3;
    *(undefined8 *)(puVar2 + 2) = uVar16;
    puVar3 = pnVar7[iVar5].m_backend.data._M_elems + 8;
    *(undefined8 *)puVar3 = uVar14;
    *(undefined8 *)(puVar3 + 2) = uVar15;
    puVar3 = pnVar7[iVar5].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar3 = uVar12;
    *(undefined8 *)(puVar3 + 2) = uVar13;
    *(undefined8 *)&pnVar7[iVar5].m_backend.data = uVar10;
    *(undefined8 *)(pnVar7[iVar5].m_backend.data._M_elems + 2) = uVar11;
    pnVar7[iVar5].m_backend.exp = pnVar7[iVar19].m_backend.exp;
    pnVar7[iVar5].m_backend.neg = pnVar7[iVar19].m_backend.neg;
    iVar6 = pnVar7[iVar19].m_backend.prec_elem;
    pnVar7[iVar5].m_backend.fpclass = pnVar7[iVar19].m_backend.fpclass;
    pnVar7[iVar5].m_backend.prec_elem = iVar6;
    lVar21 = (long)this->m_j;
    cStatus->data[this->m_old_j] = cStatus->data[lVar21];
  }
  pnVar7 = (x->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar10 = *(undefined8 *)(this->m_val).m_backend.data._M_elems;
  uVar11 = *(undefined8 *)((this->m_val).m_backend.data._M_elems + 2);
  uVar12 = *(undefined8 *)((this->m_val).m_backend.data._M_elems + 4);
  uVar13 = *(undefined8 *)((this->m_val).m_backend.data._M_elems + 6);
  uVar14 = *(undefined8 *)((this->m_val).m_backend.data._M_elems + 8);
  uVar15 = *(undefined8 *)((this->m_val).m_backend.data._M_elems + 10);
  uVar16 = *(undefined8 *)((this->m_val).m_backend.data._M_elems + 0xe);
  puVar3 = pnVar7[lVar21].m_backend.data._M_elems + 0xc;
  *(undefined8 *)puVar3 = *(undefined8 *)((this->m_val).m_backend.data._M_elems + 0xc);
  *(undefined8 *)(puVar3 + 2) = uVar16;
  puVar3 = pnVar7[lVar21].m_backend.data._M_elems + 8;
  *(undefined8 *)puVar3 = uVar14;
  *(undefined8 *)(puVar3 + 2) = uVar15;
  puVar3 = pnVar7[lVar21].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar3 = uVar12;
  *(undefined8 *)(puVar3 + 2) = uVar13;
  *(undefined8 *)&pnVar7[lVar21].m_backend.data = uVar10;
  *(undefined8 *)(pnVar7[lVar21].m_backend.data._M_elems + 2) = uVar11;
  pnVar7[lVar21].m_backend.exp = (this->m_val).m_backend.exp;
  pnVar7[lVar21].m_backend.neg = (this->m_val).m_backend.neg;
  iVar6 = (this->m_val).m_backend.prec_elem;
  pnVar7[lVar21].m_backend.fpclass = (this->m_val).m_backend.fpclass;
  pnVar7[lVar21].m_backend.prec_elem = iVar6;
  local_328 = cStatus;
  local_330 = y;
  if ((this->m_col).
      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .memused < 1) {
    bVar9 = false;
  }
  else {
    lVar21 = 0;
    lVar26 = 0;
    do {
      pNVar8 = (this->m_col).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      pcVar24 = &(x->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend;
      pcVar1 = (cpp_dec_float<100U,_int,_void> *)
               ((long)(pNVar8->val).m_backend.data._M_elems + lVar21);
      local_388.fpclass = cpp_dec_float_finite;
      local_388.prec_elem = 0x10;
      local_388.data._M_elems[0] = 0;
      local_388.data._M_elems[1] = 0;
      local_388.data._M_elems[2] = 0;
      local_388.data._M_elems[3] = 0;
      local_388.data._M_elems[4] = 0;
      local_388.data._M_elems[5] = 0;
      local_388.data._M_elems[6] = 0;
      local_388.data._M_elems[7] = 0;
      local_388.data._M_elems[8] = 0;
      local_388.data._M_elems[9] = 0;
      local_388.data._M_elems[10] = 0;
      local_388.data._M_elems[0xb] = 0;
      local_388.data._M_elems[0xc] = 0;
      local_388.data._M_elems[0xd] = 0;
      local_388.data._M_elems._56_5_ = 0;
      local_388.data._M_elems[0xf]._1_3_ = 0;
      local_388.exp = 0;
      local_388.neg = false;
      pcVar25 = pcVar1;
      if ((&local_388 != pcVar24) && (pcVar25 = pcVar24, pcVar1 != &local_388)) {
        local_388.data._M_elems._0_8_ = *(undefined8 *)(pcVar1->data)._M_elems;
        local_388.data._M_elems._8_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 2);
        local_388.data._M_elems._16_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 4);
        local_388.data._M_elems._24_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 6);
        local_388.data._M_elems._32_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 8);
        local_388.data._M_elems._40_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 10);
        local_388.data._M_elems._48_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 0xc);
        uVar10 = *(undefined8 *)((pcVar1->data)._M_elems + 0xe);
        local_388.data._M_elems._56_5_ = SUB85(uVar10,0);
        local_388.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar10 >> 0x28);
        local_388.exp = *(int *)((long)(&(pNVar8->val).m_backend.data + 1) + lVar21);
        local_388.neg = *(bool *)((long)(&(pNVar8->val).m_backend.data + 1) + lVar21 + 4);
        local_388._72_8_ = *(undefined8 *)((long)(&(pNVar8->val).m_backend.data + 1) + lVar21 + 8);
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                (&local_388,pcVar25);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                (&(s->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start
                  [*(int *)((long)(&((this->m_col).
                                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .m_elem)->val + 1) + lVar21)].m_backend,&local_388);
      lVar26 = lVar26 + 1;
      iVar19 = (this->m_col).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .memused;
      lVar21 = lVar21 + 0x54;
    } while (lVar26 < iVar19);
    bVar9 = 0 < iVar19;
  }
  pVVar17 = local_330;
  local_318.data._M_elems._0_8_ = *(undefined8 *)(this->m_obj).m_backend.data._M_elems;
  local_318.data._M_elems._8_8_ = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 2);
  local_318.data._M_elems._16_8_ = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 4);
  local_318.data._M_elems._24_8_ = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 6);
  local_318.data._M_elems._32_8_ = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 8);
  local_318.data._M_elems._40_8_ = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 10);
  local_318.data._M_elems._48_8_ = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 0xc);
  local_318.data._M_elems._56_8_ = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 0xe);
  local_318.exp = (this->m_obj).m_backend.exp;
  local_318.neg = (this->m_obj).m_backend.neg;
  local_318.fpclass = (this->m_obj).m_backend.fpclass;
  local_318.prec_elem = (this->m_obj).m_backend.prec_elem;
  if (bVar9) {
    lVar26 = 0;
    lVar21 = 0;
    do {
      pNVar8 = (this->m_col).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      pcVar24 = &(pVVar17->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start
                 [*(int *)((long)(&pNVar8->val + 1) + lVar26)].m_backend;
      pcVar1 = (cpp_dec_float<100U,_int,_void> *)
               ((long)(pNVar8->val).m_backend.data._M_elems + lVar26);
      local_388.fpclass = cpp_dec_float_finite;
      local_388.prec_elem = 0x10;
      local_388.data._M_elems[0] = 0;
      local_388.data._M_elems[1] = 0;
      local_388.data._M_elems[2] = 0;
      local_388.data._M_elems[3] = 0;
      local_388.data._M_elems[4] = 0;
      local_388.data._M_elems[5] = 0;
      local_388.data._M_elems[6] = 0;
      local_388.data._M_elems[7] = 0;
      local_388.data._M_elems[8] = 0;
      local_388.data._M_elems[9] = 0;
      local_388.data._M_elems[10] = 0;
      local_388.data._M_elems[0xb] = 0;
      local_388.data._M_elems[0xc] = 0;
      local_388.data._M_elems[0xd] = 0;
      local_388.data._M_elems._56_5_ = 0;
      local_388.data._M_elems[0xf]._1_3_ = 0;
      local_388.exp = 0;
      local_388.neg = false;
      pcVar25 = pcVar1;
      if ((&local_388 != pcVar24) && (pcVar25 = pcVar24, pcVar1 != &local_388)) {
        local_388.data._M_elems._0_8_ = *(undefined8 *)(pcVar1->data)._M_elems;
        local_388.data._M_elems._8_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 2);
        local_388.data._M_elems._16_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 4);
        local_388.data._M_elems._24_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 6);
        local_388.data._M_elems._32_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 8);
        local_388.data._M_elems._40_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 10);
        local_388.data._M_elems._48_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 0xc);
        uVar10 = *(undefined8 *)((pcVar1->data)._M_elems + 0xe);
        local_388.data._M_elems._56_5_ = SUB85(uVar10,0);
        local_388.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar10 >> 0x28);
        local_388.exp = *(int *)((long)(&(pNVar8->val).m_backend.data + 1) + lVar26);
        local_388.neg = *(bool *)((long)(&(pNVar8->val).m_backend.data + 1) + lVar26 + 4);
        local_388._72_8_ = *(undefined8 *)((long)(&(pNVar8->val).m_backend.data + 1) + lVar26 + 8);
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                (&local_388,pcVar25);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                (&local_318,&local_388);
      lVar21 = lVar21 + 1;
      lVar26 = lVar26 + 0x54;
    } while (lVar21 < (this->m_col).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused);
  }
  iVar19 = this->m_j;
  pnVar22 = (r->val).
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = pnVar22[iVar19].m_backend.data._M_elems + 0xc;
  *(undefined8 *)puVar3 = local_318.data._M_elems._48_8_;
  *(undefined8 *)(puVar3 + 2) = local_318.data._M_elems._56_8_;
  puVar3 = pnVar22[iVar19].m_backend.data._M_elems + 8;
  *(undefined8 *)puVar3 = local_318.data._M_elems._32_8_;
  *(undefined8 *)(puVar3 + 2) = local_318.data._M_elems._40_8_;
  puVar3 = pnVar22[iVar19].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar3 = local_318.data._M_elems._16_8_;
  *(undefined8 *)(puVar3 + 2) = local_318.data._M_elems._24_8_;
  *(undefined8 *)pnVar22[iVar19].m_backend.data._M_elems = local_318.data._M_elems._0_8_;
  *(undefined8 *)(pnVar22[iVar19].m_backend.data._M_elems + 2) = local_318.data._M_elems._8_8_;
  pnVar22[iVar19].m_backend.exp = local_318.exp;
  pnVar22[iVar19].m_backend.neg = local_318.neg;
  pnVar22[iVar19].m_backend.fpclass = local_318.fpclass;
  pnVar22[iVar19].m_backend.prec_elem = local_318.prec_elem;
  fVar23 = (this->m_lower).m_backend.fpclass;
  if ((fVar23 != cpp_dec_float_NaN) && ((this->m_upper).m_backend.fpclass != cpp_dec_float_NaN)) {
    iVar19 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                       (&(this->m_lower).m_backend,&(this->m_upper).m_backend);
    if (iVar19 == 0) {
      VVar20 = FIXED;
      goto LAB_004353c3;
    }
    fVar23 = (this->m_lower).m_backend.fpclass;
  }
  local_208 = *(undefined8 *)(this->m_val).m_backend.data._M_elems;
  uStack_200 = *(undefined8 *)((this->m_val).m_backend.data._M_elems + 2);
  local_1f8 = *(undefined8 *)((this->m_val).m_backend.data._M_elems + 4);
  uStack_1f0 = *(undefined8 *)((this->m_val).m_backend.data._M_elems + 6);
  local_1e8 = *(undefined8 *)((this->m_val).m_backend.data._M_elems + 8);
  uStack_1e0 = *(undefined8 *)((this->m_val).m_backend.data._M_elems + 10);
  local_1d8 = *(undefined8 *)((this->m_val).m_backend.data._M_elems + 0xc);
  uStack_1d0 = *(undefined8 *)((this->m_val).m_backend.data._M_elems + 0xe);
  iVar19 = (this->m_val).m_backend.exp;
  bVar9 = (this->m_val).m_backend.neg;
  local_248 = *(uint (*) [2])(this->m_lower).m_backend.data._M_elems;
  auStack_240 = *(uint (*) [2])((this->m_lower).m_backend.data._M_elems + 2);
  local_238 = (this->m_lower).m_backend.data._M_elems[4];
  uStack_234 = (this->m_lower).m_backend.data._M_elems[5];
  uStack_230 = (this->m_lower).m_backend.data._M_elems[6];
  uStack_22c = (this->m_lower).m_backend.data._M_elems[7];
  local_228 = (this->m_lower).m_backend.data._M_elems[8];
  uStack_224 = (this->m_lower).m_backend.data._M_elems[9];
  uStack_220 = (this->m_lower).m_backend.data._M_elems[10];
  uStack_21c = (this->m_lower).m_backend.data._M_elems[0xb];
  local_218 = (this->m_lower).m_backend.data._M_elems[0xc];
  uStack_214 = (this->m_lower).m_backend.data._M_elems[0xd];
  uStack_210 = (this->m_lower).m_backend.data._M_elems[0xe];
  uStack_20c = (this->m_lower).m_backend.data._M_elems[0xf];
  local_330 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)CONCAT44(local_330._4_4_,(this->m_lower).m_backend.exp);
  bVar4 = (this->m_lower).m_backend.neg;
  iVar6 = (this->m_lower).m_backend.prec_elem;
  uVar10._0_4_ = (this->m_val).m_backend.fpclass;
  uVar10._4_4_ = (this->m_val).m_backend.prec_elem;
  local_320 = &this->m_upper;
  (*(this->super_PostStep)._vptr_PostStep[7])(&local_178,this);
  local_d8 = local_208;
  uStack_d0 = uStack_200;
  local_c8 = local_1f8;
  uStack_c0 = uStack_1f0;
  local_b8 = local_1e8;
  uStack_b0 = uStack_1e0;
  local_a8 = local_1d8;
  uStack_a0 = uStack_1d0;
  local_128.m_backend.data._M_elems[5] = uStack_234;
  local_128.m_backend.data._M_elems[4] = local_238;
  local_128.m_backend.data._M_elems[7] = uStack_22c;
  local_128.m_backend.data._M_elems[6] = uStack_230;
  local_128.m_backend.data._M_elems[9] = uStack_224;
  local_128.m_backend.data._M_elems[8] = local_228;
  local_128.m_backend.data._M_elems[0xb] = uStack_21c;
  local_128.m_backend.data._M_elems[10] = uStack_220;
  local_128.m_backend.data._M_elems[0xd] = uStack_214;
  local_128.m_backend.data._M_elems[0xc] = local_218;
  local_128.m_backend.data._M_elems[0xf] = uStack_20c;
  local_128.m_backend.data._M_elems[0xe] = uStack_210;
  local_128.m_backend.data._M_elems[0] = local_248[0];
  local_128.m_backend.data._M_elems[1] = local_248[1];
  local_128.m_backend.data._M_elems[2] = auStack_240[0];
  local_128.m_backend.data._M_elems[3] = auStack_240[1];
  local_128.m_backend.exp = (int)local_330;
  local_128.m_backend.prec_elem = iVar6;
  local_128.m_backend.fpclass = fVar23;
  local_128.m_backend.neg = bVar4;
  local_98 = iVar19;
  local_94 = bVar9;
  local_90 = uVar10;
  relDiff<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
            (&local_80,(soplex *)&local_d8,&local_128,pnVar22);
  local_388.data._M_elems[0xc] = local_80.m_backend.data._M_elems[0xc];
  local_388.data._M_elems[0xd] = local_80.m_backend.data._M_elems[0xd];
  local_388.data._M_elems._56_5_ = local_80.m_backend.data._M_elems._56_5_;
  local_388.data._M_elems[0xf]._1_3_ = local_80.m_backend.data._M_elems[0xf]._1_3_;
  local_388.data._M_elems[8] = local_80.m_backend.data._M_elems[8];
  local_388.data._M_elems[9] = local_80.m_backend.data._M_elems[9];
  local_388.data._M_elems[10] = local_80.m_backend.data._M_elems[10];
  local_388.data._M_elems[0xb] = local_80.m_backend.data._M_elems[0xb];
  local_388.data._M_elems[4] = local_80.m_backend.data._M_elems[4];
  local_388.data._M_elems[5] = local_80.m_backend.data._M_elems[5];
  local_388.data._M_elems[6] = local_80.m_backend.data._M_elems[6];
  local_388.data._M_elems[7] = local_80.m_backend.data._M_elems[7];
  local_388.data._M_elems[0] = local_80.m_backend.data._M_elems[0];
  local_388.data._M_elems[1] = local_80.m_backend.data._M_elems[1];
  uVar10 = local_388.data._M_elems._0_8_;
  local_388.data._M_elems[2] = local_80.m_backend.data._M_elems[2];
  local_388.data._M_elems[3] = local_80.m_backend.data._M_elems[3];
  local_388.exp = local_80.m_backend.exp;
  local_388.neg = local_80.m_backend.neg;
  local_388.fpclass = local_80.m_backend.fpclass;
  local_388.prec_elem = local_80.m_backend.prec_elem;
  pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)(local_80.m_backend._72_8_ & 0xffffffff);
  if ((local_80.m_backend.neg == true) &&
     (local_388.data._M_elems[0] = local_80.m_backend.data._M_elems[0],
     local_388.data._M_elems[0] != 0 || local_80.m_backend.fpclass != 0)) {
    local_388.neg = false;
  }
  local_388.data._M_elems._0_8_ = uVar10;
  if (((local_80.m_backend.fpclass == 2) || (local_178.fpclass == cpp_dec_float_NaN)) ||
     (iVar19 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                         (&local_388,&local_178), 0 < iVar19)) {
    local_288 = *(undefined8 *)(this->m_val).m_backend.data._M_elems;
    uStack_280 = *(undefined8 *)((this->m_val).m_backend.data._M_elems + 2);
    local_278 = *(undefined8 *)((this->m_val).m_backend.data._M_elems + 4);
    uStack_270 = *(undefined8 *)((this->m_val).m_backend.data._M_elems + 6);
    local_268 = *(undefined8 *)((this->m_val).m_backend.data._M_elems + 8);
    uStack_260 = *(undefined8 *)((this->m_val).m_backend.data._M_elems + 10);
    local_258 = *(undefined8 *)((this->m_val).m_backend.data._M_elems + 0xc);
    uStack_250 = *(undefined8 *)((this->m_val).m_backend.data._M_elems + 0xe);
    iVar19 = (this->m_val).m_backend.exp;
    bVar9 = (this->m_val).m_backend.neg;
    local_2c8 = *(uint (*) [2])(local_320->m_backend).data._M_elems;
    auStack_2c0 = *(uint (*) [2])((local_320->m_backend).data._M_elems + 2);
    local_2b8 = (local_320->m_backend).data._M_elems[4];
    uStack_2b4 = (local_320->m_backend).data._M_elems[5];
    uStack_2b0 = (local_320->m_backend).data._M_elems[6];
    uStack_2ac = (local_320->m_backend).data._M_elems[7];
    local_2a8 = (local_320->m_backend).data._M_elems[8];
    uStack_2a4 = (local_320->m_backend).data._M_elems[9];
    uStack_2a0 = (local_320->m_backend).data._M_elems[10];
    uStack_29c = (local_320->m_backend).data._M_elems[0xb];
    local_298 = (local_320->m_backend).data._M_elems[0xc];
    uStack_294 = (local_320->m_backend).data._M_elems[0xd];
    uStack_290 = (local_320->m_backend).data._M_elems[0xe];
    uStack_28c = (local_320->m_backend).data._M_elems[0xf];
    iVar5 = (this->m_upper).m_backend.exp;
    bVar4 = (this->m_upper).m_backend.neg;
    uVar11._0_4_ = (this->m_val).m_backend.fpclass;
    uVar11._4_4_ = (this->m_val).m_backend.prec_elem;
    uVar12._0_4_ = (this->m_upper).m_backend.fpclass;
    uVar12._4_4_ = (this->m_upper).m_backend.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[7])(&local_1c8,this);
    local_d8 = local_288;
    uStack_d0 = uStack_280;
    local_c8 = local_278;
    uStack_c0 = uStack_270;
    local_b8 = local_268;
    uStack_b0 = uStack_260;
    local_a8 = local_258;
    uStack_a0 = uStack_250;
    local_128.m_backend.data._M_elems[5] = uStack_2b4;
    local_128.m_backend.data._M_elems[4] = local_2b8;
    local_128.m_backend.data._M_elems[7] = uStack_2ac;
    local_128.m_backend.data._M_elems[6] = uStack_2b0;
    local_128.m_backend.data._M_elems[9] = uStack_2a4;
    local_128.m_backend.data._M_elems[8] = local_2a8;
    local_128.m_backend.data._M_elems[0xb] = uStack_29c;
    local_128.m_backend.data._M_elems[10] = uStack_2a0;
    local_128.m_backend.data._M_elems[0xd] = uStack_294;
    local_128.m_backend.data._M_elems[0xc] = local_298;
    local_128.m_backend.data._M_elems[0xf] = uStack_28c;
    local_128.m_backend.data._M_elems[0xe] = uStack_290;
    local_128.m_backend.data._M_elems[0] = local_2c8[0];
    local_128.m_backend.data._M_elems[1] = local_2c8[1];
    local_128.m_backend.data._M_elems[2] = auStack_2c0[0];
    local_128.m_backend.data._M_elems[3] = auStack_2c0[1];
    local_128.m_backend.exp = iVar5;
    local_128.m_backend.neg = bVar4;
    local_128.m_backend._72_8_ = uVar12;
    local_98 = iVar19;
    local_94 = bVar9;
    local_90 = uVar11;
    relDiff<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
              (&local_80,(soplex *)&local_d8,&local_128,pnVar22);
    pDVar18 = local_328;
    local_388.data._M_elems[0xc] = local_80.m_backend.data._M_elems[0xc];
    local_388.data._M_elems[0xd] = local_80.m_backend.data._M_elems[0xd];
    local_388.data._M_elems._56_5_ = local_80.m_backend.data._M_elems._56_5_;
    local_388.data._M_elems[0xf]._1_3_ = local_80.m_backend.data._M_elems[0xf]._1_3_;
    local_388.data._M_elems[8] = local_80.m_backend.data._M_elems[8];
    local_388.data._M_elems[9] = local_80.m_backend.data._M_elems[9];
    local_388.data._M_elems[10] = local_80.m_backend.data._M_elems[10];
    local_388.data._M_elems[0xb] = local_80.m_backend.data._M_elems[0xb];
    local_388.data._M_elems[4] = local_80.m_backend.data._M_elems[4];
    local_388.data._M_elems[5] = local_80.m_backend.data._M_elems[5];
    local_388.data._M_elems[6] = local_80.m_backend.data._M_elems[6];
    local_388.data._M_elems[7] = local_80.m_backend.data._M_elems[7];
    local_388.data._M_elems[0] = local_80.m_backend.data._M_elems[0];
    local_388.data._M_elems[1] = local_80.m_backend.data._M_elems[1];
    uVar10 = local_388.data._M_elems._0_8_;
    local_388.data._M_elems[2] = local_80.m_backend.data._M_elems[2];
    local_388.data._M_elems[3] = local_80.m_backend.data._M_elems[3];
    local_388.exp = local_80.m_backend.exp;
    local_388.neg = local_80.m_backend.neg;
    local_388.fpclass = local_80.m_backend.fpclass;
    local_388.prec_elem = local_80.m_backend.prec_elem;
    if ((local_80.m_backend.neg == true) &&
       (local_388.data._M_elems[0] = local_80.m_backend.data._M_elems[0],
       local_388.data._M_elems[0] != 0 || local_80.m_backend.fpclass != 0)) {
      local_388.neg = false;
    }
    if ((local_80.m_backend.fpclass == 2) || (local_1c8.fpclass == cpp_dec_float_NaN)) {
      VVar20 = ZERO;
      local_328 = pDVar18;
    }
    else {
      local_388.data._M_elems._0_8_ = uVar10;
      iVar19 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                         (&local_388,&local_1c8);
      VVar20 = (uint)(0 < iVar19) * 3;
      local_328 = pDVar18;
    }
  }
  else {
    VVar20 = ON_LOWER;
  }
LAB_004353c3:
  local_328->data[this->m_j] = VVar20;
  return;
}

Assistant:

void SPxMainSM<R>::FixVariablePS::execute(VectorBase<R>& x, VectorBase<R>& y, VectorBase<R>& s,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // update the index mapping; if m_correctIdx is false, we assume that this has happened already
   if(m_correctIdx)
   {
      x[m_old_j] = x[m_j];
      r[m_old_j] = r[m_j];
      cStatus[m_old_j] = cStatus[m_j];
   }

   // primal:
   x[m_j] = m_val;

   for(int k = 0; k < m_col.size(); ++k)
      s[m_col.index(k)] += m_col.value(k) * x[m_j];

   // dual:
   R val = m_obj;

   for(int k = 0; k < m_col.size(); ++k)
      val -= m_col.value(k) * y[m_col.index(k)];

   r[m_j] = val;

   // basis:
   if(m_lower == m_upper)
   {
      assert(EQrel(m_lower, m_val, this->epsilon()));

      cStatus[m_j] = SPxSolverBase<R>::FIXED;
   }
   else
   {
      assert(EQrel(m_val, m_lower, this->epsilon()) || EQrel(m_val, m_upper, this->epsilon())
             || m_val == 0.0);

      cStatus[m_j] = EQrel(m_val, m_lower, this->epsilon()) ? SPxSolverBase<R>::ON_LOWER : (EQrel(m_val,
                     m_upper, this->epsilon()) ? SPxSolverBase<R>::ON_UPPER : SPxSolverBase<R>::ZERO);
   }

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(m_correctIdx)
   {
      if(!this->checkBasisDim(rStatus, cStatus))
      {
         throw SPxInternalCodeException("XMAISM19 Dimension doesn't match after this step.");
      }
   }

#endif
}